

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

void __thiscall
TTD::ScriptContextTTD::ProcessFunctionBodyOnLoad
          (ScriptContextTTD *this,FunctionBody *body,FunctionBody *parent)

{
  bool bVar1;
  uint uVar2;
  BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar3;
  ParseableFunctionInfo *pfi;
  FunctionBody *body_00;
  FunctionBody *currfb;
  ParseableFunctionInfo *pfiMid;
  FunctionBody *pFStack_20;
  uint32 i;
  FunctionBody *parent_local;
  FunctionBody *body_local;
  ScriptContextTTD *this_local;
  
  pFStack_20 = parent;
  parent_local = body;
  body_local = (FunctionBody *)this;
  if (parent == (FunctionBody *)0x0) {
    pBVar3 = Memory::
             RecyclerRootPtr<JsUtil::BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->m_ttdPinnedRootFunctionSet);
    bVar1 = JsUtil::
            BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::Contains(pBVar3,&parent_local);
    if (bVar1) {
      TTDAbort_unrecoverable_error("We already added this function!!!");
    }
    pBVar3 = Memory::
             RecyclerRootPtr<JsUtil::BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->m_ttdPinnedRootFunctionSet);
    JsUtil::
    BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::AddNew(pBVar3,&parent_local);
  }
  JsUtil::
  BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::AddNew(&this->m_ttdFunctionBodyParentMap,&parent_local,&stack0xffffffffffffffe0);
  pfiMid._4_4_ = 0;
  while( true ) {
    uVar2 = Js::ParseableFunctionInfo::GetNestedCount(&parent_local->super_ParseableFunctionInfo);
    if (uVar2 <= pfiMid._4_4_) break;
    pfi = Js::ParseableFunctionInfo::GetNestedFunctionForExecution
                    (&parent_local->super_ParseableFunctionInfo,pfiMid._4_4_);
    body_00 = JsSupport::ForceAndGetFunctionBody(pfi);
    ProcessFunctionBodyOnLoad(this,body_00,parent_local);
    pfiMid._4_4_ = pfiMid._4_4_ + 1;
  }
  return;
}

Assistant:

void ScriptContextTTD::ProcessFunctionBodyOnLoad(Js::FunctionBody* body, Js::FunctionBody* parent)
    {
        //if this is a root (parent is null) then put this in the rootbody pin set so it isn't reclaimed on us
        if(parent == nullptr)
        {
            TTDAssert(!this->m_ttdPinnedRootFunctionSet->Contains(body), "We already added this function!!!");
            this->m_ttdPinnedRootFunctionSet->AddNew(body);
        }

        this->m_ttdFunctionBodyParentMap.AddNew(body, parent);

        for(uint32 i = 0; i < body->GetNestedCount(); ++i)
        {
            Js::ParseableFunctionInfo* pfiMid = body->GetNestedFunctionForExecution(i);
            Js::FunctionBody* currfb = TTD::JsSupport::ForceAndGetFunctionBody(pfiMid);

            this->ProcessFunctionBodyOnLoad(currfb, body);
        }
    }